

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

int http_parser_parse_url_(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  state s;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  
  u->field_set = 0;
  u->port = 0;
  if ((long)buflen < 1) {
    iVar5 = 4;
  }
  else {
    s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
    uVar11 = 7;
    lVar10 = 0;
    bVar3 = false;
    do {
      s = parse_url_char_(s,buf[lVar10]);
      switch(s) {
      case s_dead:
        goto switchD_001ebb00_caseD_1;
      default:
        __assert_fail("!\"Unexpected state\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/http_parser/http_parser.c"
                      ,0x84a,
                      "int http_parser_parse_url_(const char *, size_t, int, struct http_parser_url *)"
                     );
      case s_req_schema:
        uVar7 = 0;
        break;
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        goto switchD_001ebb00_caseD_15;
      case s_req_server:
        uVar7 = 1;
        break;
      case s_req_server_with_at:
        uVar7 = 1;
        bVar3 = true;
        break;
      case s_req_path:
        uVar7 = 3;
        break;
      case s_req_query_string:
        uVar7 = 4;
        break;
      case s_req_fragment:
        uVar7 = 5;
      }
      if (uVar7 == uVar11) {
        puVar1 = &u->field_data[uVar7].len;
        *puVar1 = *puVar1 + 1;
      }
      else {
        u->field_data[uVar7].off = (uint16_t)lVar10;
        u->field_data[uVar7].len = 1;
        u->field_set = u->field_set | (ushort)(1 << (sbyte)uVar7);
        uVar11 = uVar7;
      }
switchD_001ebb00_caseD_15:
      lVar4 = lVar10 + 1;
      lVar10 = lVar10 + 1;
    } while (buf + lVar4 < buf + buflen);
    iVar5 = (uint)!bVar3 * 2 + 2;
  }
  if ((u->field_set & 3) != 0) {
    uVar6 = (ulong)u->field_data[1].off;
    uVar8 = (ulong)u->field_data[1].len;
    u->field_data[1].len = 0;
    if (uVar8 != 0) {
      lVar10 = uVar8 + uVar6;
      do {
        if (iVar5 - 2U < 9) {
          bVar2 = buf[uVar6];
          uVar11 = (uint)bVar2;
          switch(iVar5) {
          default:
            iVar9 = 4;
            if (((bVar2 != 0x40) &&
                ((iVar9 = 3, 9 < (byte)(bVar2 - 0x30) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f)))))
               && (((0x3e < bVar2 - 0x21 ||
                    ((0x4000000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) == 0)) &&
                   (uVar11 != 0x7e)))) goto LAB_001ebd3b;
            break;
          case 4:
            iVar9 = 5;
            if (((uVar11 != 0x5b) && (iVar9 = 6, 9 < (byte)(bVar2 - 0x30))) &&
               ((0x19 < (byte)((bVar2 | 0x20) + 0x9f) &&
                ((0x32 < uVar11 - 0x2d ||
                 ((0x4000000000003U >> ((ulong)(uVar11 - 0x2d) & 0x3f) & 1) == 0))))))
            goto LAB_001ebd3b;
            break;
          case 5:
switchD_001ebbf1_caseD_5:
            iVar9 = 7;
            if (9 < (byte)(bVar2 - 0x30)) {
              if ((bVar2 | 0x20) < 0x61) {
                iVar9 = 7;
                if (uVar11 != 0x2e) {
                  iVar9 = 1;
                }
                if (uVar11 == 0x3a) {
                  iVar9 = 7;
                }
              }
              else if (0x66 < (bVar2 | 0x20)) goto LAB_001ebd3b;
            }
            break;
          case 6:
            iVar9 = 6;
            if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) &&
               (1 < uVar11 - 0x2d)) {
              if (uVar11 == 0x3a) goto LAB_001ebd33;
              if (uVar11 != 0x5f) goto LAB_001ebd3b;
            }
            break;
          case 7:
            iVar9 = 8;
            if (uVar11 != 0x5d) goto switchD_001ebbf1_caseD_5;
            break;
          case 8:
            if (uVar11 != 0x3a) goto LAB_001ebd3b;
LAB_001ebd33:
            iVar9 = 9;
            break;
          case 9:
          case 10:
            iVar9 = 10;
            if (9 < (byte)(bVar2 - 0x30)) goto LAB_001ebd3b;
          }
        }
        else {
LAB_001ebd3b:
          iVar9 = 1;
        }
        if ((iVar9 != 1) && (iVar5 = iVar9, iVar9 - 3U < 8)) {
          iVar5 = (*(code *)(&DAT_0021ae74 + *(int *)(&DAT_0021ae74 + (ulong)(iVar9 - 3U) * 4)))
                            (&u->field_data[2].len,&u->field_data[6].len,&u->field_data[1].len);
          return iVar5;
        }
        if (iVar9 == 1) {
          return 1;
        }
        lVar4 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (buf + lVar4 < buf + lVar10);
    }
    if ((iVar5 - 2U < 8) && ((0xafU >> (iVar5 - 2U & 0x1f) & 1) != 0)) {
      return 1;
    }
  }
  if (((is_connect == 0) || (s = s_dead, u->field_set == 6)) && (s = 0, (u->field_set & 4) != 0)) {
    uVar6 = strtoul(buf + u->field_data[2].off,(char **)0x0,10);
    s = s_dead;
    if (uVar6 < 0x10000) {
      u->port = (uint16_t)uVar6;
      s = 0;
    }
  }
switchD_001ebb00_caseD_1:
  return s;
}

Assistant:

int
http_parser_parse_url_(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  uf = old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char_(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* FALLTROUGH */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = p - buf;
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & ((1 << UF_SCHEMA) | (1 << UF_HOST))) != 0) {
    if (http_parse_host_(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    /* Don't bother with endp; we've already validated the string */
    unsigned long v = strtoul(buf + u->field_data[UF_PORT].off, NULL, 10);

    /* Ports have a max value of 2^16 */
    if (v > 0xffff) {
      return 1;
    }

    u->port = (uint16_t) v;
  }

  return 0;
}